

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_intmul_k(jit_State *J)

{
  IRRef2 IVar1;
  uint uVar2;
  
  IVar1 = (J->fold).right[0].field_1.op12;
  if (IVar1 == 2) {
    (J->fold).ins.field_1.o = '5';
    (J->fold).ins.field_0.op2 = (J->fold).ins.field_0.op1;
    uVar2 = 1;
  }
  else if (IVar1 == 1) {
    uVar2 = (uint)(J->fold).ins.field_0.op1;
  }
  else if (IVar1 == 0) {
    uVar2 = (uint)(J->fold).ins.field_0.op2;
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

LJFOLD(MULOV any KINT)
LJFOLDF(simplify_intmul_k)
{
  if (fright->i == 0)  /* i * 0 ==> 0 */
    return RIGHTFOLD;
  if (fright->i == 1)  /* i * 1 ==> i */
    return LEFTFOLD;
  if (fright->i == 2) {  /* i * 2 ==> i + i */
    fins->o = IR_ADDOV;
    fins->op2 = fins->op1;
    return RETRYFOLD;
  }
  return NEXTFOLD;
}